

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HydroCmd.cpp
# Opt level: O3

int check_possible_values(char *val,char **values)

{
  int iVar1;
  size_t __n;
  size_t sVar2;
  int iVar3;
  char *__s2;
  long lVar4;
  int local_34;
  
  if (val == (char *)0x0) {
    return -1;
  }
  __n = strlen(val);
  __s2 = *values;
  if (__s2 != (char *)0x0) {
    lVar4 = 0;
    local_34 = 0;
    iVar3 = 0;
    do {
      iVar1 = strncmp(val,__s2,__n);
      if (iVar1 == 0) {
        sVar2 = strlen(__s2);
        local_34 = (int)lVar4;
        if (sVar2 == __n) {
          return local_34;
        }
        iVar3 = iVar3 + 1;
      }
      __s2 = values[lVar4 + 1];
      lVar4 = lVar4 + 1;
    } while (__s2 != (char *)0x0);
    if (iVar3 == 1) {
      return local_34;
    }
    if (iVar3 != 0) {
      return -2;
    }
  }
  return -1;
}

Assistant:

static int
check_possible_values(const char *val, const char *values[])
{
  int i, found, last;
  size_t len;

  if (!val)   /* otherwise strlen() crashes below */
    return -1; /* -1 means no argument for the option */

  found = last = 0;

  for (i = 0, len = strlen(val); values[i]; ++i)
    {
      if (strncmp(val, values[i], len) == 0)
        {
          ++found;
          last = i;
          if (strlen(values[i]) == len)
            return i; /* exact macth no need to check more */
        }
    }

  if (found == 1) /* one match: OK */
    return last;

  return (found ? -2 : -1); /* return many values or none matched */
}